

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::Write(CWriter *this,GotoLabel *goto_label)

{
  int iVar1;
  bool bVar2;
  Index index;
  size_type sVar3;
  const_reference pvVar4;
  string *psVar5;
  allocator<char> local_89;
  string local_88;
  LabelName local_68;
  LabelName local_60;
  Type local_58;
  StackVar local_50;
  Type local_44;
  StackVar local_3c;
  uint local_30;
  int local_2c;
  Index i;
  Index offset;
  size_t amount;
  Label *label;
  GotoLabel *goto_label_local;
  CWriter *this_local;
  
  label = (Label *)goto_label;
  goto_label_local = (GotoLabel *)this;
  amount = (size_t)FindLabel(this,goto_label->var,true);
  bVar2 = Label::HasValue((Label *)amount);
  if (bVar2) {
    _i = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                   (*(vector<wabt::Type,_std::allocator<wabt::Type>_> **)(amount + 0x10));
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    if (sVar3 < *(ulong *)(amount + 0x18)) {
      __assert_fail("type_stack_.size() >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x497,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    if (sVar3 < _i) {
      __assert_fail("type_stack_.size() >= amount",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x498,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    if (sVar3 - _i < *(ulong *)(amount + 0x18)) {
      __assert_fail("type_stack_.size() - amount >= label->type_stack_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0x499,"void wabt::(anonymous namespace)::CWriter::Write(const GotoLabel &)");
    }
    sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&this->type_stack_);
    local_2c = ((int)sVar3 - (int)*(undefined8 *)(amount + 0x18)) - (int)_i;
    if (local_2c != 0) {
      for (local_30 = 0; local_30 < _i; local_30 = local_30 + 1) {
        index = ((int)_i - local_30) + -1 + local_2c;
        pvVar4 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                           (*(vector<wabt::Type,_std::allocator<wabt::Type>_> **)(amount + 0x10),
                            (ulong)local_30);
        local_44.enum_ = pvVar4->enum_;
        local_44.type_index_ = pvVar4->type_index_;
        StackVar::StackVar(&local_3c,index,local_44);
        iVar1 = (int)_i - local_30;
        Type::Type(&local_58,Any);
        StackVar::StackVar(&local_50,iVar1 - 1,local_58);
        (anonymous_namespace)::CWriter::
        Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[4],wabt::(anonymous_namespace)::StackVar,char_const(&)[3]>
                  ((CWriter *)this,&local_3c,(char (*) [4])0x37cd5f,&local_50,(char (*) [3])"; ");
      }
    }
  }
  WriteUnwindTryCatchStack(this,(Label *)amount);
  bVar2 = Var::is_name(*(Var **)label);
  if (bVar2) {
    psVar5 = Var::name_abi_cxx11_(*(Var **)label);
    LabelName::LocalName(&local_60,psVar5);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])"goto ",&local_60,(char (*) [2])0x37ca1e);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"$Bfunc",&local_89);
    LabelName::LocalName(&local_68,&local_88);
    (anonymous_namespace)::CWriter::
    Write<char_const(&)[6],wabt::(anonymous_namespace)::LabelName,char_const(&)[2]>
              ((CWriter *)this,(char (*) [6])"goto ",&local_68,(char (*) [2])0x37ca1e);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  return;
}

Assistant:

void CWriter::Write(const GotoLabel& goto_label) {
  const Label* label = FindLabel(goto_label.var);
  if (label->HasValue()) {
    size_t amount = label->sig.size();
    assert(type_stack_.size() >= label->type_stack_size);
    assert(type_stack_.size() >= amount);
    assert(type_stack_.size() - amount >= label->type_stack_size);
    Index offset = type_stack_.size() - label->type_stack_size - amount;
    if (offset != 0) {
      for (Index i = 0; i < amount; ++i) {
        Write(StackVar(amount - i - 1 + offset, label->sig[i]), " = ",
              StackVar(amount - i - 1), "; ");
      }
    }
  }

  WriteUnwindTryCatchStack(label);

  if (goto_label.var.is_name()) {
    Write("goto ", LabelName(goto_label.var.name()), ";");
  } else {
    // We've generated names for all labels, so we should only be using an
    // index when branching to the implicit function label, which can't be
    // named.
    Write("goto ", LabelName(kImplicitFuncLabel), ";");
  }
}